

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O2

TPZFMatrix<Fad<float>_> * __thiscall
TPZFMatrix<Fad<float>_>::operator-=(TPZFMatrix<Fad<float>_> *this,Fad<float> *val)

{
  TPZFMatrix<Fad<float>_> *pTVar1;
  FadExpr<FadUnaryMin<Fad<float>_>_> local_38;
  Fad<float> local_30;
  
  local_38.fadexpr_.expr_ = (FadUnaryMin<Fad<float>_>)(FadUnaryMin<Fad<float>_>)val;
  Fad<float>::Fad<FadUnaryMin<Fad<float>>>(&local_30,&local_38);
  pTVar1 = operator+=(this,&local_30);
  Fad<float>::~Fad(&local_30);
  return pTVar1;
}

Assistant:

TPZFMatrix<TVar> &operator-=(const TVar val )  { return operator+=( -val ); }